

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.cpp
# Opt level: O0

bool __thiscall ArmPoolCommand::Validate(ArmPoolCommand *this)

{
  ArmPool *this_00;
  u64 uVar1;
  u64 uVar2;
  u64 uVar3;
  size_t sVar4;
  bool bVar5;
  ArmPool *Pool;
  bool Result;
  ArmPoolCommand *this_local;
  
  this_00 = CArmArchitecture::GetPool(&Arm,this->PoolId);
  uVar1 = ArmPool::GetRamPos(this_00);
  uVar2 = FileManager::getVirtualAddress(g_fileManager);
  if (uVar1 != uVar2) {
    uVar3 = FileManager::getVirtualAddress(g_fileManager);
    this->RamPos = uVar3;
    ArmPool::SetRamPos(this_00,this->RamPos);
  }
  sVar4 = ArmPool::GetCount(this_00);
  bVar5 = sVar4 != this->Size;
  if (bVar5) {
    sVar4 = ArmPool::GetCount(this_00);
    this->Size = sVar4;
  }
  Pool._7_1_ = bVar5 || uVar1 != uVar2;
  FileManager::advanceMemory(g_fileManager,this->Size << 2);
  CArmArchitecture::NextPool(&Arm);
  return Pool._7_1_;
}

Assistant:

bool ArmPoolCommand::Validate()
{
	bool Result = false;
	ArmPool& Pool = Arm.GetPool(PoolId);

	if (Pool.GetRamPos() != g_fileManager->getVirtualAddress())
	{
		RamPos = g_fileManager->getVirtualAddress();
		Pool.SetRamPos(RamPos);
		Result = true;
	}
	if (Pool.GetCount() != Size)
	{
		Size = Pool.GetCount();
		Result = true;
	}

	g_fileManager->advanceMemory(Size*4);
	Arm.NextPool();
	return Result;
}